

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppFixedOverlay(bool *p_open)

{
  float fVar1;
  bool bVar2;
  ImGuiIO *pIVar3;
  ImVec4 local_28;
  ImVec2 local_18;
  bool *local_10;
  bool *p_open_local;
  
  local_10 = p_open;
  ImVec2::ImVec2(&local_18,10.0,10.0);
  ImGui::SetNextWindowPos(&local_18,0);
  ImVec4::ImVec4(&local_28,0.0,0.0,0.0,0.3);
  ImGui::PushStyleColor(2,&local_28);
  bVar2 = ImGui::Begin("Example: Fixed Overlay",local_10,0x107);
  if (bVar2) {
    ImGui::Text("Simple overlay\non the top-left side of the screen.");
    ImGui::Separator();
    pIVar3 = ImGui::GetIO();
    fVar1 = (pIVar3->MousePos).x;
    pIVar3 = ImGui::GetIO();
    ImGui::Text("Mouse Position: (%.1f,%.1f)",(double)fVar1,(double)(pIVar3->MousePos).y);
    ImGui::End();
    ImGui::PopStyleColor(1);
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppFixedOverlay(bool* p_open)
{
    ImGui::SetNextWindowPos(ImVec2(10,10));
    ImGui::PushStyleColor(ImGuiCol_WindowBg, ImVec4(0.0f, 0.0f, 0.0f, 0.3f));
    if (!ImGui::Begin("Example: Fixed Overlay", p_open, ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoSavedSettings))
    {
        ImGui::End();
        return;
    }
    ImGui::Text("Simple overlay\non the top-left side of the screen.");
    ImGui::Separator();
    ImGui::Text("Mouse Position: (%.1f,%.1f)", ImGui::GetIO().MousePos.x, ImGui::GetIO().MousePos.y);
    ImGui::End();
    ImGui::PopStyleColor();
}